

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_arithmetic.h
# Opt level: O0

char32_t testinator::detail::Arbitrary_Arithmetic<char32_t>::generate
                   (size_t generation,unsigned_long randomSeed)

{
  char32_t cVar1;
  char32_t cVar2;
  TestRegistry *this;
  uniform_int_distribution<char32_t> local_30;
  uniform_int_distribution<char32_t> dis;
  mt19937 *gen;
  unsigned_long randomSeed_local;
  size_t generation_local;
  
  if (generation == 0) {
    generation_local._4_4_ = L'\0';
  }
  else if (generation == 1) {
    generation_local._4_4_ = ::std::numeric_limits<char32_t>::min();
  }
  else if (generation == 2) {
    generation_local._4_4_ = ::std::numeric_limits<char32_t>::max();
  }
  else {
    this = GetTestRegistry();
    dis._M_param = (param_type)TestRegistry::RNG(this);
    ::std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)dis._M_param,randomSeed);
    cVar1 = ::std::numeric_limits<char32_t>::min();
    cVar2 = ::std::numeric_limits<char32_t>::max();
    ::std::uniform_int_distribution<char32_t>::uniform_int_distribution
              (&local_30,cVar1 + L'\x01',cVar2 + L'\xffffffff');
    generation_local._4_4_ =
         ::std::uniform_int_distribution<char32_t>::operator()
                   (&local_30,
                    (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                     *)dis._M_param);
  }
  return generation_local._4_4_;
}

Assistant:

static T generate(std::size_t generation, unsigned long int randomSeed)
      {
        switch (generation)
        {
          case 0:
            return 0;
          case 1:
            return std::numeric_limits<T>::min();
          case 2:
            return std::numeric_limits<T>::max();

          default:
          {
            std::mt19937& gen = testinator::GetTestRegistry().RNG();
            gen.seed(randomSeed);
            std::uniform_int_distribution<T> dis(
                std::numeric_limits<T>::min() + 1, std::numeric_limits<T>::max() - 1);
            return dis(gen);
          }
        }
      }